

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadDataSection(WasmBinaryReader *this)

{
  WasmNode ie;
  bool bVar1;
  uint uVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmDataSegment *this_00;
  WasmBinaryReader *pWVar3;
  FunctionBody *pFVar4;
  uint index;
  undefined8 in_stack_ffffffffffffffa8;
  WasmNode initExpr;
  uint32 len;
  
  initExpr.field_1._20_4_ = 0;
  pWVar3 = this;
  uVar2 = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&initExpr.field_1 + 0x14));
  if ((100000 < uVar2) && (DAT_01430302 == '\0')) {
    ThrowDecodingError(pWVar3,L"Too many data segments");
  }
  if (uVar2 != 0) {
    Js::WebAssemblyModule::AllocateDataSegs(this->m_module,uVar2);
  }
  index = 0;
  initExpr.field_1.brTable.defaultTarget = uVar2;
  while( true ) {
    if (initExpr.field_1.brTable.defaultTarget == index) {
      return;
    }
    pWVar3 = this;
    uVar2 = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&initExpr.field_1 + 0x14));
    if ((uVar2 != 0) ||
       (((this->m_module->field_0x20 & 2) == 0 &&
        ((this->m_module->m_memImport).ptr == (WasmImport *)0x0)))) break;
    pFVar4 = (this->m_funcState).body;
    if (pFVar4 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
    }
    else {
      sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar4);
      if (this->m_readerState == READER_STATE_FUNCTION) {
        pFVar4 = (this->m_funcState).body;
      }
      else {
        pFVar4 = (FunctionBody *)0x0;
      }
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar4);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
    }
    if (bVar1 != false) {
      Output::Print(L"Data Segment #%u",(ulong)index);
      Output::Print(L"\n");
      Output::Flush();
    }
    ReadInitExpr((WasmNode *)&stack0xffffffffffffffa8,this,true);
    uVar2 = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&initExpr.field_1 + 0x14));
    this_00 = (WasmDataSegment *)new<Memory::ArenaAllocator>(0x38,this->m_alloc,0x35916e);
    ie.field_1.block = initExpr.field_1.block;
    ie.op = initExpr.op;
    ie._2_6_ = initExpr._2_6_;
    ie.field_1.brTable.targetTable = initExpr.field_1.brTable.targetTable;
    ie.field_1._16_8_ = in_stack_ffffffffffffffa8;
    WasmDataSegment::WasmDataSegment(this_00,this->m_alloc,ie,uVar2,this->m_pc);
    CheckBytesLeft(this,uVar2);
    this->m_pc = this->m_pc + uVar2;
    Js::WebAssemblyModule::SetDataSeg(this->m_module,this_00,index);
    index = index + 1;
  }
  ThrowDecodingError(pWVar3,L"Unknown memory index %u",(ulong)uVar2);
}

Assistant:

void WasmBinaryReader::ReadDataSection()
{
    uint32 len = 0;
    const uint32 numSegments = LEB128(len);
    if (numSegments > Limits::GetMaxDataSegments())
    {
        ThrowDecodingError(_u("Too many data segments"));
    }

    if (numSegments > 0)
    {
        m_module->AllocateDataSegs(numSegments);
    }

    for (uint32 i = 0; i < numSegments; ++i)
    {
        uint32 index = LEB128(len);
        if (index != 0 || !(m_module->HasMemory() || m_module->HasMemoryImport()))
        {
            ThrowDecodingError(_u("Unknown memory index %u"), index);
        }
        TRACE_WASM_DECODER(_u("Data Segment #%u"), i);
        WasmNode initExpr = ReadInitExpr(true);
        uint32 dataByteLen = LEB128(len);

        WasmDataSegment* dseg = Anew(m_alloc, WasmDataSegment, m_alloc, initExpr, dataByteLen, m_pc);
        CheckBytesLeft(dataByteLen);
        m_pc += dataByteLen;
        m_module->SetDataSeg(dseg, i);
    }
}